

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_test.c
# Opt level: O1

void simple_test(int converter,double src_ratio)

{
  long lVar1;
  int error;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  SRC_DATA src_data;
  SRC_DATA local_58;
  
  printf("\tsimple_test\t(SRC ratio = %6.4f) ................. ");
  fflush(_stdout);
  if (src_ratio < 1.0) {
    dVar5 = floor(src_ratio * 2048.0);
    uVar4 = (uint)dVar5;
    uVar3 = 0x7f6;
  }
  else {
    dVar5 = floor(2048.0 / src_ratio);
    uVar3 = (int)dVar5 - 10;
    uVar4 = 0x800;
  }
  if ((int)uVar4 < 0x801) {
    local_58.end_of_input = 0;
    local_58._52_4_ = 0;
    local_58.input_frames_used = 0;
    local_58.output_frames_gen = 0;
    local_58.data_in = simple_test::input;
    local_58.input_frames = (long)(int)uVar3;
    local_58.data_out = simple_test::output;
    local_58.output_frames = 0x800;
    local_58.src_ratio = src_ratio;
    error = src_simple(&local_58,converter,1);
    if (error == 0) {
      dVar5 = ceil((double)(-(ulong)(1.0 <= src_ratio) & (ulong)src_ratio |
                           ~-(ulong)(1.0 <= src_ratio) & (ulong)(1.0 / src_ratio)));
      lVar1 = local_58.output_frames_gen;
      if (ABS((double)local_58.output_frames_gen - (double)(int)uVar3 * src_ratio) <=
          (double)((int)dVar5 * 2)) {
        puts("ok");
        return;
      }
      dVar5 = floor((double)(int)uVar3 * src_ratio);
      printf("\n\nLine %d : bad output data length %ld should be %d.\n",0x9d,lVar1,
             (ulong)(uint)(int)dVar5);
      printf("\tsrc_ratio  : %.4f\n",src_ratio);
      printf("\tinput_len  : %d\n\toutput_len : %d\n\n",(ulong)uVar3,(ulong)uVar4);
    }
    else {
      pcVar2 = src_strerror(error);
      printf("\n\nLine %d : %s\n\n",0x96,pcVar2);
    }
  }
  else {
    printf("\n\nLine %d : output_len > BUFFER_LEN\n\n",0x87);
  }
  exit(1);
}

Assistant:

static void
simple_test (int converter, double src_ratio)
{	static float input [BUFFER_LEN], output [BUFFER_LEN] ;

	SRC_DATA	src_data ;

	int input_len, output_len, error, terminate ;

	printf ("\tsimple_test\t(SRC ratio = %6.4f) ................. ", src_ratio) ;
	fflush (stdout) ;

	/* Calculate maximun input and output lengths. */
	if (src_ratio >= 1.0)
	{	output_len = BUFFER_LEN ;
		input_len = (int) floor (BUFFER_LEN / src_ratio) ;
		}
	else
	{	input_len = BUFFER_LEN ;
		output_len = (int) floor (BUFFER_LEN * src_ratio) ;
		} ;

	/* Reduce input_len by 10 so output is longer than necessary. */
	input_len -= 10 ;

	if (output_len > BUFFER_LEN)
	{	printf ("\n\nLine %d : output_len > BUFFER_LEN\n\n", __LINE__) ;
		exit (1) ;
		} ;

	memset (&src_data, 0, sizeof (src_data)) ;

	src_data.data_in = input ;
	src_data.input_frames = input_len ;

	src_data.src_ratio = src_ratio ;

	src_data.data_out = output ;
	src_data.output_frames = BUFFER_LEN ;

	if ((error = src_simple (&src_data, converter, 1)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	terminate = (int) ceil ((src_ratio >= 1.0) ? src_ratio : 1.0 / src_ratio) ;

	if (fabs (src_data.output_frames_gen - src_ratio * input_len) > 2 * terminate)
	{	printf ("\n\nLine %d : bad output data length %ld should be %d.\n", __LINE__,
					src_data.output_frames_gen, (int) floor (src_ratio * input_len)) ;
		printf ("\tsrc_ratio  : %.4f\n", src_ratio) ;
		printf ("\tinput_len  : %d\n\toutput_len : %d\n\n", input_len, output_len) ;
		exit (1) ;
		} ;

	puts ("ok") ;

	return ;
}